

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_error.hpp
# Opt level: O2

char * __thiscall boost::system::system_error::what(system_error *this)

{
  string *psVar1;
  error_category *peVar2;
  string local_30 [32];
  
  psVar1 = &this->m_what;
  if ((this->m_what)._M_string_length == 0) {
    std::runtime_error::what();
    std::__cxx11::string::assign((char *)psVar1);
    if ((this->m_what)._M_string_length != 0) {
      std::__cxx11::string::append((char *)psVar1);
    }
    peVar2 = (this->m_error_code).m_cat;
    (*peVar2->_vptr_error_category[3])(local_30,peVar2,(ulong)(uint)(this->m_error_code).m_val);
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::~string(local_30);
  }
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

inline const char * system_error::what() const BOOST_NOEXCEPT_OR_NOTHROW
    // see http://www.boost.org/more/error_handling.html for lazy build rationale
    {
      if ( m_what.empty() )
      {
#ifndef BOOST_NO_EXCEPTIONS
        try
#endif
        {
          m_what = this->std::runtime_error::what();
          if ( !m_what.empty() ) m_what += ": ";
          m_what += m_error_code.message();
        }
#ifndef BOOST_NO_EXCEPTIONS
        catch (...) { return std::runtime_error::what(); }
#endif
      }
      return m_what.c_str();
    }